

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,Index *jointObservations)

{
  Index IVar1;
  const_reference pvVar2;
  Index *in_RDX;
  undefined4 in_ESI;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  Index *pIVar3;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  
  uVar4 = in_ESI;
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (in_RDI,in_stack_ffffffffffffffc8);
  IVar1 = Globals::CastLIndexToIndex(*pvVar2);
  pIVar3 = in_RDX;
  GetNrJointObservations((PlanningUnitMADPDiscrete *)0x9d68e6);
  IVar1 = ComputeHistoryIndex((PlanningUnitMADPDiscrete *)CONCAT44(uVar4,in_stack_fffffffffffffff0),
                              (Index)((ulong)pIVar3 >> 0x20),(Index)pIVar3,in_RDX,
                              CONCAT44(IVar1,in_ESI));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex(
        Index t, const Index jointObservations[] ) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstJOHIforT.at(t)), 
                jointObservations,
                GetNrJointObservations()
                )
          );    
/*
    size_t this_JOHI=_m_firstJOHIforT.at(t);
    size_t nrJO = GetNrJointObservations();
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrJO, (double)(exponent));
        this_JOHI += jointObservations[ts] * b;
    }
    return(this_JOHI);*/
}